

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsluv.c
# Opt level: O1

void rgb2xyz(Triplet *in_out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = in_out->a;
  if (dVar1 <= 0.04045) {
    dVar1 = dVar1 / 12.92;
  }
  else {
    dVar1 = pow((dVar1 + 0.055) / 1.055,2.4);
  }
  dVar2 = in_out->b;
  if (dVar2 <= 0.04045) {
    dVar2 = dVar2 / 12.92;
  }
  else {
    dVar2 = pow((dVar2 + 0.055) / 1.055,2.4);
  }
  dVar3 = in_out->c;
  if (dVar3 <= 0.04045) {
    dVar3 = dVar3 / 12.92;
  }
  else {
    dVar3 = pow((dVar3 + 0.055) / 1.055,2.4);
  }
  in_out->a = dVar3 * 0.1804807884018343 + dVar1 * 0.4123907992659595 + dVar2 * 0.35758433938387796;
  in_out->b = dVar3 * 0.07219231536073371 + dVar1 * 0.21263900587151036 + dVar2 * 0.7151686787677559
  ;
  in_out->c = dVar3 * 0.9505321522496606 + dVar1 * 0.01933081871559185 + dVar2 * 0.11919477979462599
  ;
  return;
}

Assistant:

static void
rgb2xyz(Triplet* in_out)
{
    Triplet rgbl = { to_linear(in_out->a), to_linear(in_out->b), to_linear(in_out->c) };
    double x = dot_product(&m_inv[0], &rgbl);
    double y = dot_product(&m_inv[1], &rgbl);
    double z = dot_product(&m_inv[2], &rgbl);
    in_out->a = x;
    in_out->b = y;
    in_out->c = z;
}